

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O3

int GetLine(void)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char *__s;
  char *pcVar4;
  char *pcVar5;
  
  pcVar5 = Line1;
LAB_00362ecf:
  do {
    Line1 = pcVar5;
    __s = igets();
    if (__s == (char *)0x0) {
      return 0;
    }
    cVar1 = *__s;
    pcVar5 = __s;
  } while ((cVar1 == '\0') || (pcVar5 = Line1, cVar1 == '#'));
  while (iVar3 = isspace((int)cVar1), iVar3 != 0) {
    cVar1 = __s[1];
    __s = __s + 1;
    pcVar5 = __s;
    if (cVar1 == '\0') goto LAB_00362ecf;
  }
  Line1 = __s;
  pcVar4 = strchr(__s,0x3d);
  pcVar5 = pcVar4;
  if (pcVar4 == (char *)0x0) {
    do {
      pcVar5 = __s + 1;
      __s = __s + 1;
    } while (' ' < *pcVar5);
    *__s = '\0';
    do {
      pcVar5 = __s + 1;
      __s = __s + 1;
      if (*pcVar5 == '\0') {
        Line2 = __s;
        return 2;
      }
    } while (*pcVar5 < '!');
    Line2 = __s;
    return 2;
  }
  do {
    pcVar2 = pcVar5;
    pcVar5 = pcVar2 + -1;
    if (pcVar5 < __s) {
      return 0;
    }
  } while (*pcVar5 < '!');
  *pcVar2 = '\0';
  do {
    cVar1 = pcVar4[1];
    pcVar4 = pcVar4 + 1;
    if (cVar1 == '\0') break;
  } while (cVar1 < '!');
  if (cVar1 != '\0') {
    Line2 = pcVar4;
    return 1;
  }
  return 0;
}

Assistant:

static int GetLine (void)
{
	char *line, *line2;

	do {
		while ( (line = igets ()) )
			if (line[0] != '#')		// Skip comment lines
				break;

		if (!line)
			return 0;

		Line1 = skipwhite (line);
	} while (Line1 && *Line1 == 0);	// Loop until we get a line with
									// more than just whitespace.
	line = strchr (Line1, '=');

	if (line) {					// We have an '=' in the input line
		line2 = line;
		while (--line2 >= Line1)
			if (*line2 > ' ')
				break;

		if (line2 < Line1)
			return 0;			// Nothing before '='

		*(line2 + 1) = 0;

		line++;
		while (*line && *line <= ' ')
			line++;

		if (*line == 0)
			return 0;			// Nothing after '='

		Line2 = line;

		return 1;
	} else {					// No '=' in input line
		line = Line1 + 1;
		while (*line > ' ')
			line++;				// Get beyond first word

		*line++ = 0;
		while (*line && *line <= ' ')
			line++;				// Skip white space

		//.bex files don't have this restriction
		//if (*line == 0)
		//	return 0;			// No second word

		Line2 = line;

		return 2;
	}
}